

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChArchiveOut::out<int,double>
          (ChArchiveOut *this,
          ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
          *bVal)

{
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar1;
  _Hash_node_base *p_Var2;
  long lVar3;
  _wrap_pair<int,_double> mpair;
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  specVal;
  char buffer [20];
  _wrap_pair<int,_double> local_b0;
  ChNameValue<chrono::_wrap_pair<int,_double>_> local_a8;
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_90;
  pair<int,_double> local_58;
  char local_48 [24];
  
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  ::ChValueSpecific(&local_90,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_90,(bVal->_value->_M_h)._M_element_count);
  puVar1 = bVal->_value;
  p_Var2 = (puVar1->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    lVar3 = 0;
    do {
      sprintf(local_48,"%lu",lVar3);
      local_b0._wpair = &local_58;
      local_a8._value = &local_b0;
      local_a8._flags = '\0';
      local_a8._name = local_48;
      out<chrono::_wrap_pair<int,double>>(this,&local_a8);
      (*(this->super_ChArchive)._vptr_ChArchive[0xf])
                (this,&local_90,(bVal->_value->_M_h)._M_element_count);
      p_Var2 = p_Var2->_M_nxt;
      lVar3 = lVar3 + 1;
    } while (p_Var2 != (_Hash_node_base *)0x0);
    puVar1 = bVal->_value;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_90,(puVar1->_M_h)._M_element_count);
  local_90.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00158650;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_ChValue._name._M_dataplus._M_p != &local_90.super_ChValue._name.field_2) {
    operator_delete(local_90.super_ChValue._name._M_dataplus._M_p,
                    local_90.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out     (ChNameValue< std::unordered_map<T, Tv> > bVal) {
          ChValueSpecific< std::unordered_map<T, Tv> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre(specVal, bVal.value().size());
          int i=0;
          for ( auto it = bVal.value().begin(); it != bVal.value().end(); ++it )
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< std::pair<T, Tv> > array_key(buffer, (*it));
              this->out (array_key);
              this->out_array_between(specVal, bVal.value().size());
              ++i;
          }
          this->out_array_end(specVal, bVal.value().size());
      }